

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O2

void __thiscall ram::MinimizerEngine::Filter(MinimizerEngine *this,double frequency)

{
  pointer pIVar1;
  uint32_t uVar2;
  long lVar3;
  invalid_argument *this_00;
  ulong uVar4;
  __node_base *p_Var5;
  Index *it;
  pointer pIVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint local_5c;
  double local_58;
  undefined8 uStack_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> occurrences;
  
  if ((0.0 <= frequency) && (frequency <= 1.0)) {
    if ((frequency != 0.0) || (NAN(frequency))) {
      occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pIVar1 = (this->index_).
               super__Vector_base<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_58 = frequency;
      for (pIVar6 = (this->index_).
                    super__Vector_base<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
                    ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar1; pIVar6 = pIVar6 + 1
          ) {
        p_Var5 = &(pIVar6->locator)._M_h._M_before_begin;
        while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
          if ((*(size_type *)(p_Var5 + 1) & 1) == 0) {
            local_5c = (uint)((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&occurrences,&local_5c);
          }
          else {
            local_5c = 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                      (&occurrences,(int *)&local_5c);
          }
        }
      }
      if (occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar2 = 0xffffffff;
      }
      else {
        lVar3 = (long)occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2;
        auVar8._8_4_ = (int)((long)occurrences.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)occurrences.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 0x22);
        auVar8._0_8_ = lVar3;
        auVar8._12_4_ = 0x45300000;
        local_58 = 1.0 - local_58;
        uStack_50 = 0;
        std::
        nth_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )(occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     (long)(((auVar8._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) *
                           local_58)),
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        lVar3 = (long)occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2;
        auVar9._8_4_ = (int)((long)occurrences.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)occurrences.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 0x22);
        auVar9._0_8_ = lVar3;
        auVar9._12_4_ = 0x45300000;
        dVar7 = local_58 *
                ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
        uVar4 = (ulong)dVar7;
        uVar2 = occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4] + 1;
      }
      this->occurrence_ = uVar2;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&occurrences.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    else {
      this->occurrence_ = 0xffffffff;
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[ram::MinimizerEngine::Filter] error: invalid frequency");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void MinimizerEngine::Filter(double frequency) {
  if (!(0 <= frequency && frequency <= 1)) {
    throw std::invalid_argument(
        "[ram::MinimizerEngine::Filter] error: invalid frequency");
  }

  if (frequency == 0) {
    occurrence_ = -1;
    return;
  }

  std::vector<std::uint32_t> occurrences;
  for (const auto& it : index_) {
    for (const auto& jt : it.locator) {
      if (jt.first & 1) {
        occurrences.emplace_back(1);
      } else {
        occurrences.emplace_back(static_cast<std::uint32_t>(jt.second));
      }
    }
  }

  if (occurrences.empty()) {
    occurrence_ = -1;
    return;
  }

  std::nth_element(
      occurrences.begin(),
      occurrences.begin() + (1 - frequency) * occurrences.size(),
      occurrences.end());
  occurrence_ = occurrences[(1 - frequency) * occurrences.size()] + 1;
}